

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array-test.c++
# Opt level: O2

void __thiscall
kj::anon_unknown_0::TestNoexceptObject::~TestNoexceptObject(TestNoexceptObject *this)

{
  DebugComparison<int_&,_int_&> _kjCondition;
  
  if (this->index == -1) {
    (anonymous_namespace)::TestNoexceptObject::copiedCount =
         (anonymous_namespace)::TestNoexceptObject::copiedCount + -1;
  }
  else {
    (anonymous_namespace)::TestNoexceptObject::count =
         (anonymous_namespace)::TestNoexceptObject::count + -1;
    _kjCondition.result = this->index == (anonymous_namespace)::TestNoexceptObject::count;
    _kjCondition.right = &(anonymous_namespace)::TestNoexceptObject::count;
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    if ((!_kjCondition.result) && (_::Debug::minSeverity < 3)) {
      _kjCondition.left = &this->index;
      _::Debug::log<char_const(&)[36],kj::_::DebugComparison<int&,int&>&,int&,int&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/array-test.c++"
                 ,0x4e,ERROR,
                 "\"failed: expected \" \"(index) == (count)\", _kjCondition, index, count",
                 (char (*) [36])"failed: expected (index) == (count)",&_kjCondition,&this->index,
                 &(anonymous_namespace)::TestNoexceptObject::count);
    }
  }
  return;
}

Assistant:

~TestNoexceptObject() noexcept {
    if (index == -1) {
      --copiedCount;
    } else {
      --count;
      EXPECT_EQ(index, count);
    }
  }